

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O2

bool __thiscall
CLParser::Parse(CLParser *this,string *output,string *deps_prefix,string *filtered_output,
               string *err)

{
  ulong uVar1;
  Metrics *this_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Metric *pMVar5;
  ulong uVar6;
  string normalized;
  string include;
  ScopedMetric metrics_h_scoped;
  string line;
  uint64_t slash_bits;
  string local_70;
  string local_50;
  
  if (Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
      ::metrics_h_metric == '\0') {
    iVar3 = __cxa_guard_acquire(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar3 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar5 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&line,"CLParser::Parse",(allocator<char> *)&include);
        pMVar5 = Metrics::NewMetric(this_00,&line);
        std::__cxx11::string::~string((string *)&line);
      }
      Parse::metrics_h_metric = pMVar5;
      __cxa_guard_release(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Parse::metrics_h_metric);
  if (output == filtered_output) {
    __assert_fail("&output != filtered_output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser.cc"
                  ,0x52,"bool CLParser::Parse(const string &, const string &, string *, string *)");
  }
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    uVar1 = output->_M_string_length;
    if (uVar1 <= uVar6) break;
    uVar4 = std::__cxx11::string::find_first_of((char *)output,0x11fc3d);
    if (uVar4 == 0xffffffffffffffff) {
      uVar4 = output->_M_string_length;
    }
    std::__cxx11::string::substr((ulong)&line,(ulong)output);
    FilterShowIncludes(&include,&line,deps_prefix);
    if (include._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_70,(string *)&line);
      bVar2 = FilterInputFilename(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar2) {
        std::__cxx11::string::append((string *)filtered_output);
        std::__cxx11::string::append((char *)filtered_output);
      }
LAB_0010f1da:
      if (uVar4 < output->_M_string_length) {
        uVar4 = uVar4 + ((output->_M_dataplus)._M_p[uVar4] == '\r');
      }
      bVar2 = true;
      if (uVar4 < output->_M_string_length) {
        uVar4 = uVar4 + ((output->_M_dataplus)._M_p[uVar4] == '\n');
      }
    }
    else {
      normalized._M_dataplus._M_p = (pointer)&normalized.field_2;
      normalized._M_string_length = 0;
      normalized.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&normalized);
      bVar2 = CanonicalizePath(&normalized,&slash_bits,err);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_50,(string *)&normalized);
        bVar2 = IsSystemInclude(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar2) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this,&normalized);
        }
        std::__cxx11::string::~string((string *)&normalized);
        goto LAB_0010f1da;
      }
      std::__cxx11::string::~string((string *)&normalized);
      bVar2 = false;
      uVar4 = uVar6;
    }
    std::__cxx11::string::~string((string *)&include);
    std::__cxx11::string::~string((string *)&line);
  } while (bVar2);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return uVar1 <= uVar6;
}

Assistant:

bool CLParser::Parse(const string& output, const string& deps_prefix,
                     string* filtered_output, string* err) {
  METRIC_RECORD("CLParser::Parse");

  // Loop over all lines in the output to process them.
  assert(&output != filtered_output);
  size_t start = 0;
#ifdef _WIN32
  IncludesNormalize normalizer(".");
#endif

  while (start < output.size()) {
    size_t end = output.find_first_of("\r\n", start);
    if (end == string::npos)
      end = output.size();
    string line = output.substr(start, end - start);

    string include = FilterShowIncludes(line, deps_prefix);
    if (!include.empty()) {
      string normalized;
#ifdef _WIN32
      if (!normalizer.Normalize(include, &normalized, err))
        return false;
#else
      // TODO: should this make the path relative to cwd?
      normalized = include;
      uint64_t slash_bits;
      if (!CanonicalizePath(&normalized, &slash_bits, err))
        return false;
#endif
      if (!IsSystemInclude(normalized))
        includes_.insert(normalized);
    } else if (FilterInputFilename(line)) {
      // Drop it.
      // TODO: if we support compiling multiple output files in a single
      // cl.exe invocation, we should stash the filename.
    } else {
      filtered_output->append(line);
      filtered_output->append("\n");
    }

    if (end < output.size() && output[end] == '\r')
      ++end;
    if (end < output.size() && output[end] == '\n')
      ++end;
    start = end;
  }

  return true;
}